

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O0

bool Jinx::Impl::StringToBoolean(String *inValue,bool *outValue)

{
  int iVar1;
  char *pcVar2;
  bool *outValue_local;
  String *inValue_local;
  
  if (outValue != (bool *)0x0) {
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                       (inValue);
    iVar1 = strcmp(pcVar2,"true");
    if (iVar1 == 0) {
      *outValue = true;
      inValue_local._7_1_ = true;
    }
    else {
      pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
               c_str(inValue);
      iVar1 = strcmp(pcVar2,"false");
      if (iVar1 == 0) {
        *outValue = false;
        inValue_local._7_1_ = true;
      }
      else {
        inValue_local._7_1_ = false;
      }
    }
    return inValue_local._7_1_;
  }
  __assert_fail("outValue",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxConversion.cpp"
                ,0x46,"bool Jinx::Impl::StringToBoolean(const String &, bool *)");
}

Assistant:

inline_t bool StringToBoolean(const String & inValue, bool * outValue)
	{
		assert(outValue);
		if (strcmp(inValue.c_str(), "true") == 0)
		{
			*outValue = true;
			return true;
		}
		else if (strcmp(inValue.c_str(), "false") == 0)
		{
			*outValue = false;
			return true;
		}
		return false;
	}